

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall cfd::core::Psbt::Combine(Psbt *this,Psbt *transaction)

{
  CfdException *pCVar1;
  int ret;
  wally_psbt *src_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  int local_84;
  wally_psbt *local_80;
  Transaction local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  GetData((ByteData *)&local_78,transaction);
  ByteData::GetBytes(&local_38,(ByteData *)&local_78);
  if (local_78.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    operator_delete(local_78.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_80 = (wally_psbt *)0x0;
  local_84 = wally_psbt_from_bytes
                       (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,&local_80);
  if (local_84 == 0) {
    local_84 = wally_psbt_combine((wally_psbt *)this->wally_psbt_pointer_,local_80);
    wally_psbt_free(local_80);
    if (local_84 == 0) {
      RebuildTransaction(&local_78,this->wally_psbt_pointer_);
      Transaction::operator=(&this->base_tx_,&local_78);
      Transaction::~Transaction(&local_78);
      if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    local_78.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5d7afb;
    local_78.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x851;
    local_78.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x5d86ff;
    logger::log<int&>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"wally_psbt_combine NG[{}]"
                      ,&local_84);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_78.vin_;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"psbt combine error.","");
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_78);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_78.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5d7afb;
  local_78.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x848;
  local_78.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x5d86ff;
  logger::log<int&>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,
                    "wally_psbt_from_bytes NG[{}]",&local_84);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_78.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_78.vin_;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"psbt from bytes error.","")
  ;
  CfdException::CfdException(pCVar1,kCfdInternalError,(string *)&local_78);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::Combine(const Psbt &transaction) {
  std::vector<uint8_t> bytes = transaction.GetData().GetBytes();
  struct wally_psbt *src_pointer = nullptr;
  int ret = wally_psbt_from_bytes(bytes.data(), bytes.size(), &src_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_from_bytes NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt from bytes error.");
  }

  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  ret = wally_psbt_combine(psbt_pointer, src_pointer);
  wally_psbt_free(src_pointer);  // free
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_combine NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt combine error.");
  }
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}